

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

BuildKey * llbuild::buildsystem::BuildKey::fromData(BuildKey *__return_storage_ptr__,KeyType *key)

{
  Kind KVar1;
  KeyType *key_local;
  BuildKey *result;
  
  BuildKey(__return_storage_ptr__,key);
  KVar1 = getKind(__return_storage_ptr__);
  if (KVar1 == Unknown) {
    __assert_fail("result.getKind() != Kind::Unknown && \"invalid key\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                  ,299,"static BuildKey llbuild::buildsystem::BuildKey::fromData(const KeyType &)");
  }
  return __return_storage_ptr__;
}

Assistant:

static BuildKey fromData(const KeyType& key) {
    auto result = BuildKey(key);
    assert(result.getKind() != Kind::Unknown && "invalid key");
    return result;
  }